

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataArrayListTest_Test::
~OpenDDLParserTest_parseDataArrayListTest_Test(OpenDDLParserTest_parseDataArrayListTest_Test *this)

{
  OpenDDLParserTest_parseDataArrayListTest_Test *this_local;
  
  ~OpenDDLParserTest_parseDataArrayListTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataArrayListTest) {
    char token[] =
            "{\n"
            "    { 1.0, 2.0, 3.0 },\n"
            "    { 0.5, 0.0, 0.5 },\n"
            "    { 0.0, -1.0, 4.0 }\n"
            "}\n";
    size_t len(0);
    char *end(findEnd(token, len));
    DataArrayList *dtArrayList(nullptr);

    char *in = OpenDDLParser::parseDataArrayList(token, end, Value::ValueType::ddl_none, &dtArrayList);
    ASSERT_FALSE(nullptr == dtArrayList);
    const size_t numItems(countItems(dtArrayList->m_dataList));
    EXPECT_NE(token, in);
    EXPECT_EQ(3U, numItems);

    delete dtArrayList;
}